

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O0

CRYPTO_BUFFER *
crypto_buffer_new(uint8_t *data,size_t len,int data_is_static,CRYPTO_BUFFER_POOL *pool)

{
  uint8_t *puVar1;
  CRYPTO_BUFFER *local_78;
  CRYPTO_BUFFER *old;
  CRYPTO_BUFFER *pCStack_68;
  int inserted;
  CRYPTO_BUFFER *duplicate;
  CRYPTO_BUFFER *buf;
  CRYPTO_BUFFER *duplicate_1;
  CRYPTO_BUFFER tmp;
  CRYPTO_BUFFER_POOL *pool_local;
  int data_is_static_local;
  size_t len_local;
  uint8_t *data_local;
  
  tmp._24_8_ = pool;
  if (pool != (CRYPTO_BUFFER_POOL *)0x0) {
    duplicate_1 = (CRYPTO_BUFFER *)pool;
    tmp.pool = (CRYPTO_BUFFER_POOL *)data;
    tmp.data = (uint8_t *)len;
    CRYPTO_MUTEX_lock_read(&pool->lock);
    buf = lh_CRYPTO_BUFFER_retrieve
                    (*(lhash_st_CRYPTO_BUFFER **)tmp._24_8_,(CRYPTO_BUFFER *)&duplicate_1);
    if (((data_is_static != 0) && (buf != (CRYPTO_BUFFER *)0x0)) && (buf->data_is_static == 0)) {
      buf = (CRYPTO_BUFFER *)0x0;
    }
    if (buf != (CRYPTO_BUFFER *)0x0) {
      CRYPTO_refcount_inc(&buf->references);
    }
    CRYPTO_MUTEX_unlock_read((CRYPTO_MUTEX *)(tmp._24_8_ + 8));
    if (buf != (CRYPTO_BUFFER *)0x0) {
      return buf;
    }
  }
  duplicate = (CRYPTO_BUFFER *)OPENSSL_zalloc(0x20);
  if (duplicate == (CRYPTO_BUFFER *)0x0) {
    data_local = (uint8_t *)0x0;
  }
  else {
    if (data_is_static == 0) {
      puVar1 = (uint8_t *)OPENSSL_memdup(data,len);
      duplicate->data = puVar1;
      if ((len != 0) && (duplicate->data == (uint8_t *)0x0)) {
        OPENSSL_free(duplicate);
        return (CRYPTO_BUFFER *)0x0;
      }
    }
    else {
      duplicate->data = data;
      duplicate->data_is_static = 1;
    }
    duplicate->len = len;
    duplicate->references = 1;
    if (tmp._24_8_ == 0) {
      data_local = (uint8_t *)duplicate;
    }
    else {
      duplicate->pool = (CRYPTO_BUFFER_POOL *)tmp._24_8_;
      CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)(tmp._24_8_ + 8));
      pCStack_68 = lh_CRYPTO_BUFFER_retrieve(*(lhash_st_CRYPTO_BUFFER **)tmp._24_8_,duplicate);
      if (((data_is_static != 0) && (pCStack_68 != (CRYPTO_BUFFER *)0x0)) &&
         (pCStack_68->data_is_static == 0)) {
        pCStack_68 = (CRYPTO_BUFFER *)0x0;
      }
      old._4_4_ = 0;
      if (pCStack_68 == (CRYPTO_BUFFER *)0x0) {
        local_78 = (CRYPTO_BUFFER *)0x0;
        old._4_4_ = lh_CRYPTO_BUFFER_insert
                              (*(lhash_st_CRYPTO_BUFFER **)tmp._24_8_,&local_78,duplicate);
      }
      else {
        CRYPTO_refcount_inc(&pCStack_68->references);
      }
      CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)(tmp._24_8_ + 8));
      if (old._4_4_ == 0) {
        crypto_buffer_free_object(duplicate);
        data_local = (uint8_t *)pCStack_68;
      }
      else {
        data_local = (uint8_t *)duplicate;
      }
    }
  }
  return (CRYPTO_BUFFER *)data_local;
}

Assistant:

static CRYPTO_BUFFER *crypto_buffer_new(const uint8_t *data, size_t len,
                                        int data_is_static,
                                        CRYPTO_BUFFER_POOL *pool) {
  if (pool != NULL) {
    CRYPTO_BUFFER tmp;
    tmp.data = (uint8_t *)data;
    tmp.len = len;
    tmp.pool = pool;

    CRYPTO_MUTEX_lock_read(&pool->lock);
    CRYPTO_BUFFER *duplicate = lh_CRYPTO_BUFFER_retrieve(pool->bufs, &tmp);
    if (data_is_static && duplicate != NULL && !duplicate->data_is_static) {
      // If the new |CRYPTO_BUFFER| would have static data, but the duplicate
      // does not, we replace the old one with the new static version.
      duplicate = NULL;
    }
    if (duplicate != NULL) {
      CRYPTO_refcount_inc(&duplicate->references);
    }
    CRYPTO_MUTEX_unlock_read(&pool->lock);

    if (duplicate != NULL) {
      return duplicate;
    }
  }

  CRYPTO_BUFFER *const buf =
      reinterpret_cast<CRYPTO_BUFFER *>(OPENSSL_zalloc(sizeof(CRYPTO_BUFFER)));
  if (buf == NULL) {
    return NULL;
  }

  if (data_is_static) {
    buf->data = (uint8_t *)data;
    buf->data_is_static = 1;
  } else {
    buf->data = reinterpret_cast<uint8_t *>(OPENSSL_memdup(data, len));
    if (len != 0 && buf->data == NULL) {
      OPENSSL_free(buf);
      return NULL;
    }
  }

  buf->len = len;
  buf->references = 1;

  if (pool == NULL) {
    return buf;
  }

  buf->pool = pool;

  CRYPTO_MUTEX_lock_write(&pool->lock);
  CRYPTO_BUFFER *duplicate = lh_CRYPTO_BUFFER_retrieve(pool->bufs, buf);
  if (data_is_static && duplicate != NULL && !duplicate->data_is_static) {
    // If the new |CRYPTO_BUFFER| would have static data, but the duplicate does
    // not, we replace the old one with the new static version.
    duplicate = NULL;
  }
  int inserted = 0;
  if (duplicate == NULL) {
    CRYPTO_BUFFER *old = NULL;
    inserted = lh_CRYPTO_BUFFER_insert(pool->bufs, &old, buf);
    // |old| may be non-NULL if a match was found but ignored. |pool->bufs| does
    // not increment refcounts, so there is no need to clean up after the
    // replacement.
  } else {
    CRYPTO_refcount_inc(&duplicate->references);
  }
  CRYPTO_MUTEX_unlock_write(&pool->lock);

  if (!inserted) {
    // We raced to insert |buf| into the pool and lost, or else there was an
    // error inserting.
    crypto_buffer_free_object(buf);
    return duplicate;
  }

  return buf;
}